

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.hpp
# Opt level: O2

void rsg::(anonymous_namespace)::convertValueRangeTempl<float,bool>
               (ConstValueRangeAccess src,ValueRangeAccess dst)

{
  float fVar1;
  
  fVar1 = (src.m_max)->floatVal;
  (dst.super_ConstValueRangeAccess.m_min)->boolVal = 0.0 < (src.m_min)->floatVal;
  (dst.super_ConstValueRangeAccess.m_max)->boolVal = 0.0 < fVar1;
  return;
}

Assistant:

ConstValueAccess			getMax					(void) const	{ return ConstValueAccess(*m_type, m_max);	}